

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O1

char * __thiscall
glcts::TextureCubeMapArrayTextureSizeRTFragmentShader::getFragmentShaderCode
          (TextureCubeMapArrayTextureSizeRTFragmentShader *this)

{
  return 
  "${VERSION}\n\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nuniform highp samplerCubeArray       texture_std_sampler;\nuniform highp samplerCubeArrayShadow texture_shw_sampler;\n\nlayout (location = 0) out uvec4 texture_std_size;\nlayout (location = 1) out uvec4 texture_shw_size;\n\nvoid main()\n{\n    texture_std_size = uvec4( textureSize(texture_std_sampler, 0), 0 );\n    texture_shw_size = uvec4( textureSize(texture_shw_sampler, 0), 0 );\n}\n"
  ;
}

Assistant:

const char* TextureCubeMapArrayTextureSizeRTFragmentShader::getFragmentShaderCode(void)
{
	static const char* result = "${VERSION}\n"
								"\n"
								"${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"uniform highp samplerCubeArray       texture_std_sampler;\n"
								"uniform highp samplerCubeArrayShadow texture_shw_sampler;\n"
								"\n"
								"layout (location = 0) out uvec4 texture_std_size;\n"
								"layout (location = 1) out uvec4 texture_shw_size;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    texture_std_size = uvec4( textureSize(texture_std_sampler, 0), 0 );\n"
								"    texture_shw_size = uvec4( textureSize(texture_shw_sampler, 0), 0 );\n"
								"}\n";

	return result;
}